

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVisitor.cpp
# Opt level: O0

void __thiscall
llvm::DWARFYAML::VisitorImpl<const_llvm::DWARFYAML::Data>::traverseDebugInfo
          (VisitorImpl<const_llvm::DWARFYAML::Data> *this)

{
  uint64_t uVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  const_reference pvVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  vector<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_> *this_00;
  vector<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_> *pvVar8;
  uint32_t *puVar9;
  raw_ostream *prVar10;
  reference pAVar11;
  reference pFVar12;
  pointer pAVar13;
  Hex8 *pHVar14;
  pointer pFVar15;
  uint64_t *puVar16;
  bool local_2d9;
  StringRef local_228;
  StringRef local_218;
  MemoryBufferRef local_208;
  size_type local_1e8;
  size_type writeSize_2;
  StringRef local_1d0;
  MemoryBufferRef local_1c0;
  size_type local_1a0;
  size_type writeSize_1;
  StringRef local_188;
  MemoryBufferRef local_178;
  size_type local_158;
  size_type writeSize;
  StringRef local_140;
  MemoryBufferRef local_130;
  byte local_10b;
  Form local_10a;
  bool Indirect;
  const_iterator cStack_108;
  Form Form;
  __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
  local_100;
  __normal_iterator<const_llvm::DWARFYAML::AttributeAbbrev_*,_std::vector<llvm::DWARFYAML::AttributeAbbrev,_std::allocator<llvm::DWARFYAML::AttributeAbbrev>_>_>
  local_f8;
  const_iterator AbbrForm;
  const_iterator FormVal;
  value_type *Abbrev;
  size_t RelativeAbbrIndex;
  reference local_d0;
  Entry *Entry;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_> *__range2;
  size_t AbbrevEnd;
  vector<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_> *local_a0;
  size_t AbbrevStart;
  uint local_8c;
  reference pUStack_88;
  uint32_t offset_1;
  Unit *Unit;
  const_iterator __end0;
  const_iterator __begin0;
  vector<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_> *__range1;
  uint64_t local_58;
  uint64_t offset;
  size_t i;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  abbrByteOffsetToDeclsIndex;
  VisitorImpl<const_llvm::DWARFYAML::Data> *this_local;
  
  abbrByteOffsetToDeclsIndex._M_h._M_single_bucket = (__node_base_ptr)this;
  std::
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::unordered_map((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   *)&i);
  for (offset = 0; uVar1 = offset,
      sVar4 = std::vector<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>::size
                        (&this->DebugInfo->AbbrevDecls), uVar1 < sVar4; offset = offset + 1) {
    pvVar5 = std::vector<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>::
             operator[](&this->DebugInfo->AbbrevDecls,offset);
    local_58 = pvVar5->ListOffset;
    sVar6 = std::
            unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::count((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     *)&i,&local_58);
    uVar1 = offset;
    if (sVar6 == 0) {
      pmVar7 = std::
               unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::operator[]((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                             *)&i,&local_58);
      *pmVar7 = uVar1;
    }
  }
  this_00 = &this->DebugInfo->CompileUnits;
  __end0 = std::vector<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>::begin
                     (this_00);
  Unit = (Unit *)std::vector<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>::end
                           (this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_llvm::DWARFYAML::Unit_*,_std::vector<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>_>
                                *)&Unit);
    if (!bVar2) {
      std::
      unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ::~unordered_map((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                        *)&i);
      return;
    }
    pUStack_88 = __gnu_cxx::
                 __normal_iterator<const_llvm::DWARFYAML::Unit_*,_std::vector<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>_>
                 ::operator*(&__end0);
    local_8c = pUStack_88->AbbrOffset;
    AbbrevStart = (size_t)local_8c;
    sVar6 = std::
            unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::count((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     *)&i,&AbbrevStart);
    if (sVar6 == 0) {
      __assert_fail("abbrByteOffsetToDeclsIndex.count(offset)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVisitor.cpp"
                    ,0x56,
                    "void llvm::DWARFYAML::VisitorImpl<const llvm::DWARFYAML::Data>::traverseDebugInfo() [T = const llvm::DWARFYAML::Data]"
                   );
    }
    AbbrevEnd = (size_t)local_8c;
    pmVar7 = std::
             unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[]((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                           *)&i,&AbbrevEnd);
    local_a0 = (vector<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_> *)*pmVar7;
    pvVar5 = std::vector<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>::
             operator[](&this->DebugInfo->AbbrevDecls,(size_type)local_a0);
    if (pvVar5->ListOffset != (ulong)local_8c) {
      __assert_fail("DebugInfo.AbbrevDecls[AbbrevStart].ListOffset == offset",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVisitor.cpp"
                    ,0x58,
                    "void llvm::DWARFYAML::VisitorImpl<const llvm::DWARFYAML::Data>::traverseDebugInfo() [T = const llvm::DWARFYAML::Data]"
                   );
    }
    __range2 = local_a0;
    while( true ) {
      pvVar8 = (vector<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_> *)
               std::vector<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>::size
                         (&this->DebugInfo->AbbrevDecls);
      bVar2 = false;
      if (__range2 < pvVar8) {
        pvVar5 = std::vector<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>::
                 operator[](&this->DebugInfo->AbbrevDecls,(size_type)__range2);
        puVar9 = yaml::Hex32::operator_cast_to_unsigned_int_(&pvVar5->Code);
        bVar2 = *puVar9 != 0;
      }
      if (!bVar2) break;
      __range2 = (vector<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_> *)
                 ((long)&(__range2->
                         super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    if (local_a0 != __range2) {
      (*this->_vptr_VisitorImpl[5])(this,pUStack_88);
      bVar2 = std::vector<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>::empty
                        (&pUStack_88->Entries);
      if (!bVar2) {
        pvVar8 = &pUStack_88->Entries;
        __end0_1 = std::vector<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>::
                   begin(pvVar8);
        Entry = (Entry *)std::
                         vector<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>::
                         end(pvVar8);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end0_1,
                                  (__normal_iterator<const_llvm::DWARFYAML::Entry_*,_std::vector<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>_>
                                   *)&Entry), bVar2) {
          local_d0 = __gnu_cxx::
                     __normal_iterator<const_llvm::DWARFYAML::Entry_*,_std::vector<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>_>
                     ::operator*(&__end0_1);
          (*this->_vptr_VisitorImpl[7])(this,pUStack_88,local_d0);
          RelativeAbbrIndex._4_4_ = 0;
          bVar2 = yaml::Hex32::operator==
                            (&local_d0->AbbrCode,(uint32_t *)((long)&RelativeAbbrIndex + 4));
          if (!bVar2) {
            puVar9 = yaml::Hex32::operator_cast_to_unsigned_int_(&local_d0->AbbrCode);
            pvVar8 = (vector<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_> *)
                     ((long)&(local_a0->
                             super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>
                             )._M_impl.super__Vector_impl_data._M_start + (ulong)(*puVar9 - 1));
            if (pvVar8 < __range2) {
              pvVar5 = std::
                       vector<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>::
                       operator[](&this->DebugInfo->AbbrevDecls,(size_type)pvVar8);
              AbbrForm._M_current =
                   (AttributeAbbrev *)
                   std::
                   vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>::
                   begin(&local_d0->Values);
              local_f8._M_current =
                   (AttributeAbbrev *)
                   std::
                   vector<llvm::DWARFYAML::AttributeAbbrev,_std::allocator<llvm::DWARFYAML::AttributeAbbrev>_>
                   ::begin(&pvVar5->Attributes);
              while( true ) {
                local_100._M_current =
                     (FormValue *)
                     std::
                     vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                     ::end(&local_d0->Values);
                bVar2 = __gnu_cxx::operator!=
                                  ((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                    *)&AbbrForm,&local_100);
                local_2d9 = false;
                if (bVar2) {
                  cStack_108 = std::
                               vector<llvm::DWARFYAML::AttributeAbbrev,_std::allocator<llvm::DWARFYAML::AttributeAbbrev>_>
                               ::end(&pvVar5->Attributes);
                  local_2d9 = __gnu_cxx::operator!=(&local_f8,&stack0xfffffffffffffef8);
                }
                if (local_2d9 == false) break;
                pAVar11 = __gnu_cxx::
                          __normal_iterator<const_llvm::DWARFYAML::AttributeAbbrev_*,_std::vector<llvm::DWARFYAML::AttributeAbbrev,_std::allocator<llvm::DWARFYAML::AttributeAbbrev>_>_>
                          ::operator*(&local_f8);
                pFVar12 = __gnu_cxx::
                          __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                          ::operator*((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                       *)&AbbrForm);
                (*this->_vptr_VisitorImpl[9])(this,pAVar11,pFVar12);
                pAVar13 = __gnu_cxx::
                          __normal_iterator<const_llvm::DWARFYAML::AttributeAbbrev_*,_std::vector<llvm::DWARFYAML::AttributeAbbrev,_std::allocator<llvm::DWARFYAML::AttributeAbbrev>_>_>
                          ::operator->(&local_f8);
                local_10a = pAVar13->Form;
                do {
                  local_10b = 0;
                  uVar3 = (uint)local_10a;
                  if (uVar3 == 1) {
                    pFVar15 = __gnu_cxx::
                              __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                              ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                            *)&AbbrForm);
                    puVar16 = yaml::Hex64::operator_cast_to_unsigned_long_(&pFVar15->Value);
                    onVariableSizeValue(this,*puVar16,(uint)pUStack_88->AddrSize);
                  }
                  else if (uVar3 == 3) {
                    pFVar15 = __gnu_cxx::
                              __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                              ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                            *)&AbbrForm);
                    local_1a0 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::
                                size(&pFVar15->BlockData);
                    (*this->_vptr_VisitorImpl[0xb])(this,local_1a0 & 0xffff);
                    pFVar15 = __gnu_cxx::
                              __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                              ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                            *)&AbbrForm);
                    pHVar14 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::data
                                        (&pFVar15->BlockData);
                    pFVar15 = __gnu_cxx::
                              __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                              ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                            *)&AbbrForm);
                    sVar4 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::size
                                      (&pFVar15->BlockData);
                    StringRef::StringRef(&local_1d0,(char *)pHVar14,sVar4);
                    StringRef::StringRef((StringRef *)&writeSize_2,"");
                    MemoryBufferRef::MemoryBufferRef(&local_1c0,local_1d0,_writeSize_2);
                    (*this->_vptr_VisitorImpl[0x10])();
                  }
                  else if (uVar3 == 4) {
                    pFVar15 = __gnu_cxx::
                              __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                              ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                            *)&AbbrForm);
                    local_1e8 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::
                                size(&pFVar15->BlockData);
                    (*this->_vptr_VisitorImpl[0xc])(this,local_1e8 & 0xffffffff);
                    pFVar15 = __gnu_cxx::
                              __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                              ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                            *)&AbbrForm);
                    pHVar14 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::data
                                        (&pFVar15->BlockData);
                    pFVar15 = __gnu_cxx::
                              __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                              ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                            *)&AbbrForm);
                    sVar4 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::size
                                      (&pFVar15->BlockData);
                    StringRef::StringRef(&local_218,(char *)pHVar14,sVar4);
                    StringRef::StringRef(&local_228,"");
                    MemoryBufferRef::MemoryBufferRef(&local_208,local_218,local_228);
                    (*this->_vptr_VisitorImpl[0x10])();
                  }
                  else {
                    if (uVar3 == 5) goto LAB_02086ec4;
                    if (uVar3 == 6) goto LAB_02086f02;
                    if (uVar3 == 7) goto LAB_02086f3f;
                    if (uVar3 == 8) {
                      pFVar15 = __gnu_cxx::
                                __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                              *)&AbbrForm);
                      (*this->_vptr_VisitorImpl[0xf])
                                (this,(pFVar15->CStr).Data,(pFVar15->CStr).Length);
                    }
                    else if (uVar3 == 9) {
LAB_02086a91:
                      pFVar15 = __gnu_cxx::
                                __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                              *)&AbbrForm);
                      sVar4 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::size
                                        (&pFVar15->BlockData);
                      (*this->_vptr_VisitorImpl[0xd])(this,sVar4,1);
                      pFVar15 = __gnu_cxx::
                                __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                              *)&AbbrForm);
                      pHVar14 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::
                                data(&pFVar15->BlockData);
                      pFVar15 = __gnu_cxx::
                                __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                              *)&AbbrForm);
                      sVar4 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::size
                                        (&pFVar15->BlockData);
                      StringRef::StringRef(&local_140,(char *)pHVar14,sVar4);
                      StringRef::StringRef((StringRef *)&writeSize,"");
                      MemoryBufferRef::MemoryBufferRef(&local_130,local_140,_writeSize);
                      (*this->_vptr_VisitorImpl[0x10])();
                    }
                    else if (uVar3 == 10) {
                      pFVar15 = __gnu_cxx::
                                __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                              *)&AbbrForm);
                      local_158 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::
                                  size(&pFVar15->BlockData);
                      (*this->_vptr_VisitorImpl[10])(this,local_158 & 0xff);
                      pFVar15 = __gnu_cxx::
                                __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                              *)&AbbrForm);
                      pHVar14 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::
                                data(&pFVar15->BlockData);
                      pFVar15 = __gnu_cxx::
                                __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                              *)&AbbrForm);
                      sVar4 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::size
                                        (&pFVar15->BlockData);
                      StringRef::StringRef(&local_188,(char *)pHVar14,sVar4);
                      StringRef::StringRef((StringRef *)&writeSize_1,"");
                      MemoryBufferRef::MemoryBufferRef(&local_178,local_188,_writeSize_1);
                      (*this->_vptr_VisitorImpl[0x10])();
                    }
                    else {
                      if (uVar3 - 0xb < 2) goto LAB_02086e86;
                      if (uVar3 == 0xd) {
                        pFVar15 = __gnu_cxx::
                                  __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                  ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                                *)&AbbrForm);
                        puVar16 = yaml::Hex64::operator_cast_to_unsigned_long_(&pFVar15->Value);
                        (*this->_vptr_VisitorImpl[0xe])(this,*puVar16,1);
                      }
                      else {
                        if (uVar3 == 0xe) goto LAB_020870c5;
                        if (uVar3 == 0xf) {
LAB_02086fc2:
                          pFVar15 = __gnu_cxx::
                                    __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                    ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                                  *)&AbbrForm);
                          puVar16 = yaml::Hex64::operator_cast_to_unsigned_long_(&pFVar15->Value);
                          (*this->_vptr_VisitorImpl[0xd])(this,*puVar16,1);
                        }
                        else if (uVar3 == 0x10) {
                          pFVar15 = __gnu_cxx::
                                    __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                    ::operator->((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                                  *)&AbbrForm);
                          puVar16 = yaml::Hex64::operator_cast_to_unsigned_long_(&pFVar15->Value);
                          uVar1 = *puVar16;
                          uVar3 = getRefSize(pUStack_88);
                          onVariableSizeValue(this,uVar1,uVar3);
                        }
                        else {
                          if (uVar3 == 0x11) goto LAB_02086e86;
                          if (uVar3 == 0x12) goto LAB_02086ec4;
                          if (uVar3 == 0x13) goto LAB_02086f02;
                          if (uVar3 == 0x14) {
LAB_02086f3f:
                            pFVar15 = __gnu_cxx::
                                      __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                      ::operator->((
                                                  __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                                  *)&AbbrForm);
                            puVar16 = yaml::Hex64::operator_cast_to_unsigned_long_(&pFVar15->Value);
                            (*this->_vptr_VisitorImpl[0xd])(this,*puVar16,0);
                          }
                          else {
                            if (uVar3 == 0x15) goto LAB_02086fc2;
                            if (uVar3 == 0x16) {
                              pFVar15 = __gnu_cxx::
                                        __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                        ::operator->((
                                                  __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                                  *)&AbbrForm);
                              puVar16 = yaml::Hex64::operator_cast_to_unsigned_long_
                                                  (&pFVar15->Value);
                              (*this->_vptr_VisitorImpl[0xd])(this,*puVar16,1);
                              local_10b = 1;
                              pFVar15 = __gnu_cxx::
                                        __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                        ::operator->((
                                                  __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                                  *)&AbbrForm);
                              puVar16 = yaml::Hex64::operator_cast_to_unsigned_long_
                                                  (&pFVar15->Value);
                              local_10a = (Form)*puVar16;
                              __gnu_cxx::
                              __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                              ::operator++((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                            *)&AbbrForm);
                            }
                            else {
                              if (uVar3 != 0x17) {
                                if (uVar3 == 0x18) goto LAB_02086a91;
                                if (uVar3 == 0x1c) goto LAB_02086f02;
                                if ((uVar3 != 0x1d) && (uVar3 != 0x1f)) {
                                  if (uVar3 == 0x20) {
                                    pFVar15 = __gnu_cxx::
                                              __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                              ::operator->((
                                                  __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                                  *)&AbbrForm);
                                    puVar16 = yaml::Hex64::operator_cast_to_unsigned_long_
                                                        (&pFVar15->Value);
                                    (*this->_vptr_VisitorImpl[0xd])(this,*puVar16,0);
                                    goto LAB_020871a0;
                                  }
                                  if (uVar3 == 0x24) goto LAB_02086f3f;
                                  if (uVar3 == 0x25) {
LAB_02086e86:
                                    pFVar15 = __gnu_cxx::
                                              __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                              ::operator->((
                                                  __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                                  *)&AbbrForm);
                                    puVar16 = yaml::Hex64::operator_cast_to_unsigned_long_
                                                        (&pFVar15->Value);
                                    (*this->_vptr_VisitorImpl[10])(this,(ulong)(byte)*puVar16);
                                  }
                                  else {
                                    if (uVar3 == 0x26) {
LAB_02086ec4:
                                      pFVar15 = __gnu_cxx::
                                                __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                                ::operator->((
                                                  __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                                  *)&AbbrForm);
                                      puVar16 = yaml::Hex64::operator_cast_to_unsigned_long_
                                                          (&pFVar15->Value);
                                      (*this->_vptr_VisitorImpl[0xb])(this,(ulong)(ushort)*puVar16);
                                      goto LAB_020871a0;
                                    }
                                    if (uVar3 != 0x28) {
                                      if (uVar3 == 0x29) goto LAB_02086e86;
                                      if (uVar3 == 0x2a) goto LAB_02086ec4;
                                      if (uVar3 != 0x2c) {
                                        if (uVar3 - 0x1f01 < 2) {
                                          pFVar15 = __gnu_cxx::
                                                                                                        
                                                  __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                                  ::operator->((
                                                  __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                                  *)&AbbrForm);
                                          puVar16 = yaml::Hex64::operator_cast_to_unsigned_long_
                                                              (&pFVar15->Value);
                                          (*this->_vptr_VisitorImpl[0xd])(this,*puVar16,1);
                                        }
                                        else if (uVar3 - 0x1f20 < 2) goto LAB_020870c5;
                                        goto LAB_020871a0;
                                      }
                                    }
LAB_02086f02:
                                    pFVar15 = __gnu_cxx::
                                              __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                              ::operator->((
                                                  __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                                  *)&AbbrForm);
                                    puVar16 = yaml::Hex64::operator_cast_to_unsigned_long_
                                                        (&pFVar15->Value);
                                    (*this->_vptr_VisitorImpl[0xc])(this,(ulong)(uint)*puVar16);
                                  }
                                  goto LAB_020871a0;
                                }
                              }
LAB_020870c5:
                              pFVar15 = __gnu_cxx::
                                        __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                        ::operator->((
                                                  __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                                                  *)&AbbrForm);
                              puVar16 = yaml::Hex64::operator_cast_to_unsigned_long_
                                                  (&pFVar15->Value);
                              uVar1 = *puVar16;
                              uVar3 = getOffsetSize(pUStack_88);
                              onVariableSizeValue(this,uVar1,uVar3);
                            }
                          }
                        }
                      }
                    }
                  }
LAB_020871a0:
                } while ((local_10b & 1) != 0);
                __gnu_cxx::
                __normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                ::operator++((__normal_iterator<const_llvm::DWARFYAML::FormValue_*,_std::vector<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>_>
                              *)&AbbrForm);
                __gnu_cxx::
                __normal_iterator<const_llvm::DWARFYAML::AttributeAbbrev_*,_std::vector<llvm::DWARFYAML::AttributeAbbrev,_std::allocator<llvm::DWARFYAML::AttributeAbbrev>_>_>
                ::operator++(&local_f8);
              }
              (*this->_vptr_VisitorImpl[8])(this,pUStack_88,local_d0);
            }
            else {
              prVar10 = errs();
              prVar10 = raw_ostream::operator<<(prVar10,"warning: invalid abbreviation code ");
              puVar9 = yaml::Hex32::operator_cast_to_unsigned_int_(&local_d0->AbbrCode);
              prVar10 = raw_ostream::operator<<(prVar10,*puVar9);
              prVar10 = raw_ostream::operator<<(prVar10," (range: ");
              prVar10 = raw_ostream::operator<<(prVar10,(unsigned_long)local_a0);
              prVar10 = raw_ostream::operator<<(prVar10,"..");
              prVar10 = raw_ostream::operator<<(prVar10,(unsigned_long)__range2);
              raw_ostream::operator<<(prVar10,")\n");
            }
          }
          __gnu_cxx::
          __normal_iterator<const_llvm::DWARFYAML::Entry_*,_std::vector<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>_>
          ::operator++(&__end0_1);
        }
        (*this->_vptr_VisitorImpl[6])(this,pUStack_88);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::DWARFYAML::Unit_*,_std::vector<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

void DWARFYAML::VisitorImpl<T>::traverseDebugInfo() {
  // XXX BINARYEN: Handle multiple linked compile units, each of which can
  // refer to a different abbreviation list.
  // TODO: This code appears to assume that abbreviation codes increment by 1
  // so that lookups are linear. In LLVM output that is true, but it might not
  // be in general.
  // Create a map of [byte offset into the abbreviation section] => [index in
  // DebugInfo.AbbrevDecls]. This avoids linear search for each CU.
  std::unordered_map<size_t, size_t> abbrByteOffsetToDeclsIndex;
  for (size_t i = 0; i < DebugInfo.AbbrevDecls.size(); i++) {
    auto offset = DebugInfo.AbbrevDecls[i].ListOffset;
    // The offset is the same for all entries for the same CU, so only note the
    // first as that is where the list for the CU (that LLVM DeclSet) begins.
    // That is, DebugInfo.AbbrevDecls looks like this:
    //
    //  i  CU   Abbrev  ListOffset
    // ============================
    //  0   X     X1      150
    //  1   X     X2      150
    //  2   X     X3      150
    //           ..
    //  6   Y     Y1      260
    //  7   Y     Y2      260
    //
    // Note how multiple rows i have the same CU. All those abbrevs have the
    // same ListOffset, which is the byte offset into the abbreviation section
    // for that set of abbreviations.
    if (abbrByteOffsetToDeclsIndex.count(offset)) {
      continue;
    }
    abbrByteOffsetToDeclsIndex[offset] = i;
  }
  for (auto &Unit : DebugInfo.CompileUnits) {
    // AbbrOffset is the byte offset into the abbreviation section, which we
    // need to find among the Abbrev's ListOffsets (which are the byte offsets
    // of where that abbreviation list begins).
    // TODO: Optimize this to not be O(#CUs * #abbrevs).
    auto offset = Unit.AbbrOffset;
    assert(abbrByteOffsetToDeclsIndex.count(offset));
    size_t AbbrevStart = abbrByteOffsetToDeclsIndex[offset];
    assert(DebugInfo.AbbrevDecls[AbbrevStart].ListOffset == offset);
    // Find the last entry in this abbreviation list.
    size_t AbbrevEnd = AbbrevStart;
    while (AbbrevEnd < DebugInfo.AbbrevDecls.size() &&
           DebugInfo.AbbrevDecls[AbbrevEnd].Code) {
      AbbrevEnd++;
    }
    // XXX BINARYEN If there are no abbreviations, there is nothing to
    //              do in this unit.
    if (AbbrevStart == AbbrevEnd) {
      continue;
    }
    onStartCompileUnit(Unit);
    if (Unit.Entries.empty()) { // XXX BINARYEN
      continue;
    }
    for (auto &Entry : Unit.Entries) {
      onStartDIE(Unit, Entry);
      if (Entry.AbbrCode == 0u)
        continue;
      // XXX BINARYEN valid abbreviation codes start from 1, so subtract that,
      //              and are relative to the start of the abbrev table
      auto RelativeAbbrIndex = Entry.AbbrCode - 1 + AbbrevStart;
      if (RelativeAbbrIndex >= AbbrevEnd) {
        errs() << "warning: invalid abbreviation code " << Entry.AbbrCode
               << " (range: " << AbbrevStart << ".." << AbbrevEnd << ")\n";
        continue;
      }
      auto &Abbrev = DebugInfo.AbbrevDecls[RelativeAbbrIndex];
      auto FormVal = Entry.Values.begin();
      auto AbbrForm = Abbrev.Attributes.begin();
      for (;
           FormVal != Entry.Values.end() && AbbrForm != Abbrev.Attributes.end();
           ++FormVal, ++AbbrForm) {
        onForm(*AbbrForm, *FormVal);
        dwarf::Form Form = AbbrForm->Form;
        bool Indirect;
        do {
          Indirect = false;
          switch (Form) {
          case dwarf::DW_FORM_addr:
            onVariableSizeValue(FormVal->Value, Unit.AddrSize);
            break;
          case dwarf::DW_FORM_ref_addr:
            onVariableSizeValue(FormVal->Value, getRefSize(Unit));
            break;
          case dwarf::DW_FORM_exprloc:
          case dwarf::DW_FORM_block:
            onValue((uint64_t)FormVal->BlockData.size(), true);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          case dwarf::DW_FORM_block1: {
            auto writeSize = FormVal->BlockData.size();
            onValue((uint8_t)writeSize);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          }
          case dwarf::DW_FORM_block2: {
            auto writeSize = FormVal->BlockData.size();
            onValue((uint16_t)writeSize);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          }
          case dwarf::DW_FORM_block4: {
            auto writeSize = FormVal->BlockData.size();
            onValue((uint32_t)writeSize);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          }
          case dwarf::DW_FORM_data1:
          case dwarf::DW_FORM_ref1:
          case dwarf::DW_FORM_flag:
          case dwarf::DW_FORM_strx1:
          case dwarf::DW_FORM_addrx1:
            onValue((uint8_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_data2:
          case dwarf::DW_FORM_ref2:
          case dwarf::DW_FORM_strx2:
          case dwarf::DW_FORM_addrx2:
            onValue((uint16_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_data4:
          case dwarf::DW_FORM_ref4:
          case dwarf::DW_FORM_ref_sup4:
          case dwarf::DW_FORM_strx4:
          case dwarf::DW_FORM_addrx4:
            onValue((uint32_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_data8:
          case dwarf::DW_FORM_ref8:
          case dwarf::DW_FORM_ref_sup8:
            onValue((uint64_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_sdata:
            onValue((int64_t)FormVal->Value, true);
            break;
          case dwarf::DW_FORM_udata:
          case dwarf::DW_FORM_ref_udata:
            onValue((uint64_t)FormVal->Value, true);
            break;
          case dwarf::DW_FORM_string:
            onValue(FormVal->CStr);
            break;
          case dwarf::DW_FORM_indirect:
            onValue((uint64_t)FormVal->Value, true);
            Indirect = true;
            Form = static_cast<dwarf::Form>((uint64_t)FormVal->Value);
            ++FormVal;
            break;
          case dwarf::DW_FORM_strp:
          case dwarf::DW_FORM_sec_offset:
          case dwarf::DW_FORM_GNU_ref_alt:
          case dwarf::DW_FORM_GNU_strp_alt:
          case dwarf::DW_FORM_line_strp:
          case dwarf::DW_FORM_strp_sup:
            onVariableSizeValue(FormVal->Value, getOffsetSize(Unit));
            break;
          case dwarf::DW_FORM_ref_sig8:
            onValue((uint64_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_GNU_addr_index:
          case dwarf::DW_FORM_GNU_str_index:
            onValue((uint64_t)FormVal->Value, true);
            break;
          default:
            break;
          }
        } while (Indirect);
      }
      onEndDIE(Unit, Entry);
    }
    onEndCompileUnit(Unit);
  }
}